

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.c
# Opt level: O0

void draw_time(nh_player_info *pi)

{
  bool bVar1;
  int iVar2;
  int local_30;
  int local_2c;
  int local_28;
  attr_t local_20;
  nh_bool colorchange;
  attr_t colorattr;
  int movediff;
  nh_player_info *oldpi;
  nh_player_info *pi_local;
  
  if (settings.time != '\0') {
    iVar2 = pi->moves - old_player.moves;
    if (iVar2 < 2) {
      bVar1 = false;
    }
    else {
      if (iVar2 < 100) {
        if (iVar2 < 0x32) {
          if (iVar2 < 0x14) {
            local_30 = 2;
            if (9 < iVar2) {
              local_30 = 4;
            }
          }
          else {
            local_30 = 6;
          }
          local_2c = local_30;
        }
        else {
          local_2c = 0xb;
        }
        local_28 = local_2c;
      }
      else {
        local_28 = 1;
      }
      local_20 = curses_color_attr(local_28,0);
      bVar1 = true;
    }
    if (bVar1) {
      wattr_on(statuswin,local_20,0);
    }
    wprintw(statuswin,"T:%ld",pi->moves);
    if (bVar1) {
      wattr_off(statuswin,local_20,0);
    }
  }
  return;
}

Assistant:

static void draw_time(const struct nh_player_info *pi)
{
    const struct nh_player_info *oldpi = &old_player;
    int movediff;
    attr_t colorattr;
    nh_bool colorchange;

    if (!settings.time)
	return;

    /* Give players a better idea of the passage of time. */
    movediff = pi->moves - oldpi->moves;
    if (movediff > 1) {
	colorattr = curses_color_attr(
			(movediff >= 100) ? CLR_RED :
			(movediff >=  50) ? CLR_YELLOW :
			(movediff >=  20) ? CLR_CYAN :
			(movediff >=  10) ? CLR_BLUE :
					    CLR_GREEN, 0);
	colorchange = TRUE;
    } else {
	colorchange = FALSE;
    }

    if (colorchange)
	wattron(statuswin, colorattr);
    wprintw(statuswin, "T:%ld", pi->moves);
    if (colorchange)
	wattroff(statuswin, colorattr);
}